

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu_layer_t.h
# Opt level: O1

void __thiscall relu_layer_t::activate(relu_layer_t *this)

{
  undefined1 auVar1 [16];
  float *pfVar2;
  int _x;
  int _y;
  int _z;
  
  if (0 < (this->super_layer_t).in.size.x) {
    _x = 0;
    do {
      if (0 < (this->super_layer_t).in.size.y) {
        _y = 0;
        do {
          if (0 < (this->super_layer_t).in.size.z) {
            _z = 0;
            do {
              pfVar2 = tensor_t<float>::get(&(this->super_layer_t).in,_x,_y,_z);
              auVar1 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)*pfVar2));
              pfVar2 = tensor_t<float>::get(&(this->super_layer_t).out,_x,_y,_z);
              *pfVar2 = auVar1._0_4_;
              _z = _z + 1;
            } while (_z < (this->super_layer_t).in.size.z);
          }
          _y = _y + 1;
        } while (_y < (this->super_layer_t).in.size.y);
      }
      _x = _x + 1;
    } while (_x < (this->super_layer_t).in.size.x);
  }
  return;
}

Assistant:

void activate() {
    for (int i = 0; i < in.size.x; i++)
      for (int j = 0; j < in.size.y; j++)
        for (int z = 0; z < in.size.z; z++) {
          float v = in(i, j, z);
          if (v < 0)
            v = 0;
          out(i, j, z) = v;
        }

  }